

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *pOVar4;
  OutPt *pOVar5;
  OutPt *btmPt2;
  
LAB_001136cd:
  do {
    pOVar4 = pp;
    pp = pOVar4;
    btmPt2 = (OutPt *)0x0;
    while( true ) {
      do {
        do {
          pp = pp->Next;
          if (pp == pOVar4) {
            pOVar5 = pOVar4;
            if (btmPt2 != (OutPt *)0x0) {
              while (btmPt2 != pOVar4) {
                bVar3 = FirstIsBottomPt(pp,btmPt2);
                if (!bVar3) {
                  pOVar5 = btmPt2;
                }
                do {
                  do {
                    btmPt2 = btmPt2->Next;
                  } while ((btmPt2->Pt).X != (pOVar5->Pt).X);
                } while ((btmPt2->Pt).Y != (pOVar5->Pt).Y);
              }
            }
            return pOVar5;
          }
          lVar1 = (pOVar4->Pt).Y;
          lVar2 = (pp->Pt).Y;
          if (lVar1 < lVar2) goto LAB_001136cd;
        } while (lVar2 != lVar1);
        lVar1 = (pOVar4->Pt).X;
        lVar2 = (pp->Pt).X;
      } while (lVar1 < lVar2);
      if (lVar2 < lVar1) break;
      if ((pp->Next != pOVar4) && (pp->Prev != pOVar4)) {
        btmPt2 = pp;
      }
    }
  } while( true );
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->Next;
  while (p != pp)
  {
    if (p->Pt.Y > pp->Pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->Pt.Y == pp->Pt.Y && p->Pt.X <= pp->Pt.X)
    {
      if (p->Pt.X < pp->Pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->Next != pp && p->Prev != pp) dups = p;
      }
    }
    p = p->Next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at BottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->Next;
      while (dups->Pt != pp->Pt) dups = dups->Next;
    }
  }
  return pp;
}